

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O2

void http_on_response_handler______internal(http_s *h,http_settings_s *settings)

{
  uint64_t key_hash;
  FIOBJ o;
  fio_str_info_s val;
  
  if (http_upgrade_hash == 0) {
    http_upgrade_hash = fiobj_hash_string("upgrade",7);
  }
  key_hash = http_upgrade_hash;
  h->udata = settings->udata;
  o = fiobj_hash_get2(h->headers,key_hash);
  if (o != 0) {
    fiobj_obj2cstr(&val,o);
    (*settings->on_upgrade)(h,val.data,val.len);
    return;
  }
  (*settings->on_response)(h);
  return;
}

Assistant:

void http_on_response_handler______internal(http_s *h,
                                            http_settings_s *settings) {
  if (!http_upgrade_hash)
    http_upgrade_hash = fiobj_hash_string("upgrade", 7);
  h->udata = settings->udata;
  FIOBJ t = fiobj_hash_get2(h->headers, http_upgrade_hash);
  if (t == FIOBJ_INVALID) {
    settings->on_response(h);
    return;
  } else {
    fio_str_info_s val = fiobj_obj2cstr(t);
    settings->on_upgrade(h, val.data, val.len);
  }
}